

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<TFad<6,_double>_>::AddKel
          (TPZMatrix<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *elmat,
          TPZVec<long> *source,TPZVec<long> *destinationindex)

{
  int iVar1;
  long *plVar2;
  long *col;
  long *plVar3;
  TFad<6,_double> *this_00;
  TPZVec<long> *in_RCX;
  TPZVec<long> *in_RDX;
  long *in_RDI;
  TFad<6,_double> prevval;
  int64_t jeqs;
  int64_t ieqs;
  int64_t jeq;
  int64_t ieq;
  int64_t jcoef;
  int64_t icoef;
  int64_t nelem;
  TFad<6,_double> *in_stack_fffffffffffffe78;
  TFad<6,_double> *in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe90;
  int64_t in_stack_fffffffffffffe98;
  TPZFMatrix<TFad<6,_double>_> *in_stack_fffffffffffffea0;
  undefined1 local_128 [64];
  undefined1 local_e8 [80];
  TFad<6,_double> local_98;
  _func_int **local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  int64_t local_28;
  TPZVec<long> *local_20;
  TPZVec<long> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = TPZVec<long>::NElements(in_RDX);
  TFad<6,_double>::TFad(in_stack_fffffffffffffe80);
  iVar1 = (**(code **)(*in_RDI + 0x80))();
  if (iVar1 == 0) {
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      plVar2 = TPZVec<long>::operator[](local_20,local_30);
      local_40 = *plVar2;
      col = TPZVec<long>::operator[](local_18,local_30);
      local_50 = *col;
      for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
        plVar3 = TPZVec<long>::operator[](local_20,local_38);
        local_48 = *plVar3;
        this_00 = (TFad<6,_double> *)TPZVec<long>::operator[](local_18,local_38);
        local_58 = (this_00->super_TPZSavable)._vptr_TPZSavable;
        (**(code **)(*in_RDI + 0x120))(local_128,in_RDI,local_40,local_48);
        TFad<6,_double>::operator=(this_00,in_stack_fffffffffffffe78);
        TFad<6,_double>::~TFad((TFad<6,_double> *)0x1314f78);
        in_stack_fffffffffffffe78 =
             TPZFMatrix<TFad<6,_double>_>::operator()
                       (in_stack_fffffffffffffea0,(int64_t)plVar2,(int64_t)col);
        TFad<6,_double>::operator+=(&local_98,in_stack_fffffffffffffe78);
        (**(code **)(*in_RDI + 0x118))(in_RDI,local_40,local_48,&local_98);
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      plVar2 = TPZVec<long>::operator[](local_20,local_30);
      local_40 = *plVar2;
      plVar2 = TPZVec<long>::operator[](local_18,local_30);
      local_50 = *plVar2;
      for (local_38 = local_30; local_38 < local_28; local_38 = local_38 + 1) {
        plVar2 = TPZVec<long>::operator[](local_20,local_38);
        local_48 = *plVar2;
        plVar2 = TPZVec<long>::operator[](local_18,local_38);
        local_58 = (_func_int **)*plVar2;
        (**(code **)(*in_RDI + 0x120))(local_e8,in_RDI,local_40,local_48);
        TFad<6,_double>::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        TFad<6,_double>::~TFad((TFad<6,_double> *)0x1314d61);
        in_stack_fffffffffffffea0 =
             (TPZFMatrix<TFad<6,_double>_> *)
             TPZFMatrix<TFad<6,_double>_>::operator()
                       (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                        in_stack_fffffffffffffe90);
        TFad<6,_double>::operator+=(&local_98,(TFad<6,_double> *)in_stack_fffffffffffffea0);
        (**(code **)(*in_RDI + 0x118))(in_RDI,local_40,local_48,&local_98);
      }
    }
  }
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x131503e);
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}